

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-sign.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  string plain;
  string key;
  string filename;
  string local_860 [32];
  string local_840 [32];
  ofstream ascFile;
  ostream local_810 [496];
  ofstream os;
  byte abStack_600 [480];
  ifstream textFile;
  streambuf local_410 [504];
  ifstream keyFile;
  streambuf local_208 [504];
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: rsa-sign <private key> <text file>");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = 0;
  }
  else {
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    plain._M_dataplus._M_p = (pointer)&plain.field_2;
    plain._M_string_length = 0;
    plain.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&keyFile);
    std::ifstream::ifstream(&textFile);
    std::ifstream::open((char *)&keyFile,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&ascFile);
      std::ostream::operator<<(local_810,local_208);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&key,(string *)&os);
      std::__cxx11::string::~string((string *)&os);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ascFile);
    }
    std::ifstream::open((char *)&textFile,(_Ios_Openmode)argv[2]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&ascFile);
      std::ostream::operator<<(local_810,local_410);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&plain,(string *)&os);
      std::__cxx11::string::~string((string *)&os);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ascFile);
    }
    if ((key._M_string_length == 0) || (plain._M_string_length == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing key or text.");
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar4 = 1;
    }
    else {
      std::__cxx11::string::string(local_840,(string *)&key);
      std::__cxx11::string::string(local_860,(string *)&plain);
      pcVar3 = (char *)VerifyRSA::sign(local_840,local_860);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::string::~string(local_840);
      std::ofstream::ofstream(&ascFile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,argv[2],(allocator<char> *)&os);
      std::__cxx11::string::append((char *)&filename);
      std::ofstream::ofstream(&os,filename._M_dataplus._M_p,_S_out);
      bVar5 = (abStack_600[*(long *)(_os + -0x18)] & 5) == 0;
      if (bVar5) {
        std::operator<<((ostream *)&os,pcVar3);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to write signature!");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      uVar4 = (uint)!bVar5;
      std::ofstream::~ofstream(&os);
      std::__cxx11::string::~string((string *)&filename);
      std::ofstream::~ofstream(&ascFile);
    }
    std::ifstream::~ifstream(&textFile);
    std::ifstream::~ifstream(&keyFile);
    std::__cxx11::string::~string((string *)&plain);
    std::__cxx11::string::~string((string *)&key);
  }
  return uVar4;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-sign <private key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain;
    std::ifstream keyFile, textFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }

    if (key.empty() || plain.empty()) {
        std::cerr << "Missing key or text." << std::endl;
        return 1;
    }

    char* signature = VerifyRSA::sign(key, plain);
    if (sizeof(signature)<1) {
        std::cerr << "Unable to sign file!" << std::endl;
        return 1;
    }

    std::ofstream ascFile;
    std::string filename = argv[2];
    filename.append(".asc");
    std::ofstream os(filename.c_str());
    if (!os) {
        std::cerr << "Failed to write signature!" << std::endl;
        return 1;
    }
    else { os << signature; }
    return 0;
}